

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall
Logging::logValue(Logging *this,long populationID,int neuronID,int valueType,double value)

{
  iterator iVar1;
  iterator __position;
  iterator iVar2;
  int local_28;
  int local_24;
  double local_20;
  long local_18;
  double local_10;
  
  local_28 = valueType;
  local_24 = neuronID;
  local_20 = value;
  local_18 = populationID;
  local_10 = Clock::getCurrentTime(this->clock);
  iVar1._M_current =
       (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->value_time,iVar1,&local_10);
  }
  else {
    *iVar1._M_current = local_10;
    (this->value_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  __position._M_current =
       (this->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&this->value_populationID,__position,&local_18);
  }
  else {
    *__position._M_current = local_18;
    (this->value_populationID).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar2._M_current =
       (this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->value_neuronID,iVar2,&local_24);
  }
  else {
    *iVar2._M_current = local_24;
    (this->value_neuronID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->value_valueType,iVar2,&local_28);
  }
  else {
    *iVar2._M_current = local_28;
    (this->value_valueType).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar1._M_current =
       (this->value_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->value_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->value_value,iVar1,&local_20);
  }
  else {
    *iVar1._M_current = local_20;
    (this->value_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  return;
}

Assistant:

void Logging::logValue(long populationID, int neuronID, int valueType, double value) {
    value_time.push_back(clock->getCurrentTime());
    value_populationID.push_back(populationID);
    value_neuronID.push_back(neuronID);
    value_valueType.push_back(valueType);
    value_value.push_back(value);
}